

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.hpp
# Opt level: O2

__sighandler_t __thiscall
wigwag::signal<void_()>::~signal(signal<void_()> *this,int __sig,__sighandler_t __handler)

{
  signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *psVar1;
  __sighandler_t extraout_RAX;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_signal_hpp:104:49)>
  sg;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_signal_hpp:104:49)>
  local_18;
  
  psVar1 = (this->_impl)._s._ptr._raw;
  if (psVar1 != (signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
                 *)0x0) {
    std::recursive_mutex::lock
              (&(psVar1->
                super_listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
                ).super_lock_primitive._mutex);
    local_18._moved = false;
    local_18._f.this = this;
    wigwag::detail::
    listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
    ::finalize_nodes(&((this->_impl)._s._ptr._raw)->
                      super_listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
                    );
    wigwag::detail::
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/include/wigwag/signal.hpp:104:49)>
    ::~scope_guard(&local_18);
  }
  wigwag::detail::
  intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  ::~intrusive_ptr((intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
                    *)this);
  return extraout_RAX;
}

Assistant:

~signal()
        {
            if (_impl)
            {
                _impl->get_lock_primitive().lock_nonrecursive();
                auto sg = detail::at_scope_exit([&] { _impl->get_lock_primitive().unlock_nonrecursive(); } );

                _impl->finalize_nodes();
            }
        }